

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

void __thiscall TileWire::followWire(TileWire *this,Direction direction,State state)

{
  uint uVar1;
  bool bVar2;
  Vector2u *pVVar3;
  Board *pBVar4;
  reference pvVar5;
  Configuration *pCVar6;
  ostream *poVar7;
  int in_ESI;
  Tile *in_RDI;
  pair<TileWire_*,_Direction> *wire;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
  *__range3;
  bool *exitDirections_1;
  Direction currentDirection;
  TileWire *currentWire;
  bool *exitDirections;
  FollowWireStage stage;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  Tile *in_stack_fffffffffffffed0;
  Board *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  Board *in_stack_ffffffffffffff58;
  Tile *in_stack_ffffffffffffff68;
  TileWire *in_stack_ffffffffffffff70;
  __normal_iterator<std::pair<TileWire_*,_Direction>_*,_std::vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
  local_88;
  vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
  *local_80;
  Vector2<unsigned_int> local_78;
  Vector2<unsigned_int> local_70;
  Vector2<unsigned_int> local_68;
  Vector2<unsigned_int> local_60;
  byte *local_58;
  Direction local_4c;
  TileWire *local_48;
  Vector2<unsigned_int> local_40;
  Vector2<unsigned_int> local_38;
  Vector2<unsigned_int> local_30;
  Vector2<unsigned_int> local_28;
  byte *local_20;
  int local_14;
  int local_c;
  
  local_14 = 0;
  local_c = in_ESI;
  _addNextTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (Direction)((ulong)in_RDI >> 0x20),(State *)in_stack_ffffffffffffff58,
               (FollowWireStage *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  bVar2 = std::
          stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
          ::empty((stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   *)0x1a3003);
  if (!bVar2) {
    std::
    stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
    ::pop((stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
           *)0x1a301a);
    local_20 = &in_RDI[(long)(int)in_RDI->_direction * 2].field_0x21 +
               (long)local_c * 4 + (long)*(int *)&in_RDI[8].field_0x24 * 0x10;
    if (((*local_20 & 1) != 0) && (pVVar3 = Tile::getPosition(in_RDI), pVVar3->y != 0)) {
      in_stack_ffffffffffffff58 = Tile::getBoardPtr(in_RDI);
      pVVar3 = Tile::getPosition(in_RDI);
      in_stack_ffffffffffffff54 = pVVar3->x;
      pVVar3 = Tile::getPosition(in_RDI);
      sf::Vector2<unsigned_int>::Vector2(&local_28,in_stack_ffffffffffffff54,pVVar3->y - 1);
      Board::getTile(in_stack_ffffffffffffff58,&local_28);
      _addNextTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (Direction)((ulong)in_RDI >> 0x20),(State *)in_stack_ffffffffffffff58,
                   (FollowWireStage *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
      ;
    }
    if ((local_20[1] & 1) != 0) {
      pVVar3 = Tile::getPosition(in_RDI);
      in_stack_ffffffffffffff50 = pVVar3->x;
      pBVar4 = Tile::getBoardPtr(in_RDI);
      pVVar3 = Board::getSize(pBVar4);
      if (in_stack_ffffffffffffff50 < pVVar3->x - 1) {
        pBVar4 = Tile::getBoardPtr(in_RDI);
        pVVar3 = Tile::getPosition(in_RDI);
        uVar1 = pVVar3->x;
        pVVar3 = Tile::getPosition(in_RDI);
        sf::Vector2<unsigned_int>::Vector2(&local_30,uVar1 + 1,pVVar3->y);
        Board::getTile(pBVar4,&local_30);
        _addNextTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (Direction)((ulong)in_RDI >> 0x20),(State *)in_stack_ffffffffffffff58,
                     (FollowWireStage *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
    }
    if ((local_20[2] & 1) != 0) {
      pVVar3 = Tile::getPosition(in_RDI);
      uVar1 = pVVar3->y;
      pBVar4 = Tile::getBoardPtr(in_RDI);
      pVVar3 = Board::getSize(pBVar4);
      if (uVar1 < pVVar3->y - 1) {
        pBVar4 = Tile::getBoardPtr(in_RDI);
        pVVar3 = Tile::getPosition(in_RDI);
        uVar1 = pVVar3->x;
        pVVar3 = Tile::getPosition(in_RDI);
        sf::Vector2<unsigned_int>::Vector2(&local_38,uVar1,pVVar3->y + 1);
        Board::getTile(pBVar4,&local_38);
        _addNextTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (Direction)((ulong)in_RDI >> 0x20),(State *)in_stack_ffffffffffffff58,
                     (FollowWireStage *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
    }
    if (((local_20[3] & 1) != 0) && (pVVar3 = Tile::getPosition(in_RDI), pVVar3->x != 0)) {
      pBVar4 = Tile::getBoardPtr(in_RDI);
      pVVar3 = Tile::getPosition(in_RDI);
      uVar1 = pVVar3->x;
      pVVar3 = Tile::getPosition(in_RDI);
      sf::Vector2<unsigned_int>::Vector2(&local_40,uVar1 - 1,pVVar3->y);
      Board::getTile(pBVar4,&local_40);
      _addNextTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (Direction)((ulong)in_RDI >> 0x20),(State *)in_stack_ffffffffffffff58,
                   (FollowWireStage *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
      ;
    }
    while (bVar2 = std::
                   stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                   ::empty((stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                            *)0x1a336a), ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar5 = std::
               stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
               ::top((stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                      *)0x1a3381);
      local_48 = pvVar5->first;
      pvVar5 = std::
               stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
               ::top((stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                      *)0x1a3398);
      local_4c = pvVar5->second;
      std::
      stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
      ::pop((stack<std::pair<TileWire_*,_Direction>,_std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
             *)0x1a33ae);
      local_58 = &in_RDI[(long)(int)(local_48->super_Tile)._direction * 2].field_0x21 +
                 (long)(int)local_4c * 4 + (long)(int)local_48->_type * 0x10;
      if ((((*local_58 & 1) != 0) && (local_4c != SOUTH)) &&
         (pVVar3 = Tile::getPosition(&local_48->super_Tile), pVVar3->y != 0)) {
        pBVar4 = Tile::getBoardPtr(in_RDI);
        pVVar3 = Tile::getPosition(&local_48->super_Tile);
        uVar1 = pVVar3->x;
        pVVar3 = Tile::getPosition(&local_48->super_Tile);
        sf::Vector2<unsigned_int>::Vector2(&local_60,uVar1,pVVar3->y - 1);
        Board::getTile(pBVar4,&local_60);
        _addNextTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (Direction)((ulong)in_RDI >> 0x20),(State *)in_stack_ffffffffffffff58,
                     (FollowWireStage *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
      if (((local_58[1] & 1) != 0) && (local_4c != WEST)) {
        pVVar3 = Tile::getPosition(&local_48->super_Tile);
        uVar1 = pVVar3->x;
        pBVar4 = Tile::getBoardPtr(in_RDI);
        pVVar3 = Board::getSize(pBVar4);
        if (uVar1 < pVVar3->x - 1) {
          pBVar4 = Tile::getBoardPtr(in_RDI);
          pVVar3 = Tile::getPosition(&local_48->super_Tile);
          uVar1 = pVVar3->x;
          pVVar3 = Tile::getPosition(&local_48->super_Tile);
          sf::Vector2<unsigned_int>::Vector2(&local_68,uVar1 + 1,pVVar3->y);
          Board::getTile(pBVar4,&local_68);
          _addNextTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (Direction)((ulong)in_RDI >> 0x20),(State *)in_stack_ffffffffffffff58,
                       (FollowWireStage *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        }
      }
      if (((local_58[2] & 1) != 0) && (local_4c != NORTH)) {
        pVVar3 = Tile::getPosition(&local_48->super_Tile);
        uVar1 = pVVar3->y;
        pBVar4 = Tile::getBoardPtr(in_RDI);
        pVVar3 = Board::getSize(pBVar4);
        if (uVar1 < pVVar3->y - 1) {
          pBVar4 = Tile::getBoardPtr(in_RDI);
          pVVar3 = Tile::getPosition(&local_48->super_Tile);
          in_stack_fffffffffffffef4 = pVVar3->x;
          pVVar3 = Tile::getPosition(&local_48->super_Tile);
          sf::Vector2<unsigned_int>::Vector2(&local_70,in_stack_fffffffffffffef4,pVVar3->y + 1);
          Board::getTile(pBVar4,&local_70);
          _addNextTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (Direction)((ulong)in_RDI >> 0x20),(State *)in_stack_ffffffffffffff58,
                       (FollowWireStage *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        }
      }
      if ((((local_58[3] & 1) != 0) && (local_4c != EAST)) &&
         (pVVar3 = Tile::getPosition(&local_48->super_Tile), pVVar3->x != 0)) {
        in_stack_fffffffffffffee8 = Tile::getBoardPtr(in_RDI);
        pVVar3 = Tile::getPosition(&local_48->super_Tile);
        uVar1 = pVVar3->x;
        pVVar3 = Tile::getPosition(&local_48->super_Tile);
        sf::Vector2<unsigned_int>::Vector2(&local_78,uVar1 - 1,pVVar3->y);
        Board::getTile(in_stack_fffffffffffffee8,&local_78);
        _addNextTile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (Direction)((ulong)in_RDI >> 0x20),(State *)in_stack_ffffffffffffff58,
                     (FollowWireStage *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
    }
    if (local_14 == 2) {
      _fixTraversedWires((TileWire *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (State)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      pCVar6 = Simulator::getConfig();
      if ((pCVar6->pauseOnConflict & 1U) != 0) {
        if (Board::numStateErrors < 10) {
          in_stack_fffffffffffffed0 =
               (Tile *)std::operator<<((ostream *)&std::cout,
                                       "Detected state conflict in wire at position (");
          pVVar3 = Tile::getPosition(in_RDI);
          poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffed0,pVVar3->x);
          poVar7 = std::operator<<(poVar7,", ");
          pVVar3 = Tile::getPosition(in_RDI);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,pVVar3->y);
          poVar7 = std::operator<<(poVar7,").");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        Board::numStateErrors = Board::numStateErrors + 1;
        local_80 = &traversedWires;
        local_88._M_current =
             (pair<TileWire_*,_Direction> *)
             std::
             vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
             ::begin((vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                      *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        std::
        vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ::end((vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
               *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::pair<TileWire_*,_Direction>_*,_std::vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                                   *)in_stack_fffffffffffffed0,
                                  (__normal_iterator<std::pair<TileWire_*,_Direction>_*,_std::vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8)),
              bVar2) {
          __gnu_cxx::
          __normal_iterator<std::pair<TileWire_*,_Direction>_*,_std::vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
          ::operator*(&local_88);
          Tile::setHighlight(in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
          __gnu_cxx::
          __normal_iterator<std::pair<TileWire_*,_Direction>_*,_std::vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>_>
          ::operator++(&local_88);
        }
      }
    }
    std::
    vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>::
    clear((vector<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
           *)0x1a3886);
  }
  return;
}

Assistant:

void TileWire::followWire(Direction direction, State state) {
    assert(traversedWires.empty());
    assert(wireNodes.empty());
    
    //cout << "Follow wire started at (" << getPosition().x << ", " << getPosition().y << ")." << endl;
    
    FollowWireStage stage = INITIAL_STAGE;
    _addNextTile(this, direction, state, stage);    // Add the first wire to the traversal. If it did not connect or was already checked then we return, otherwise continue traversal.
    if (wireNodes.empty()) {
        return;
    }
    wireNodes.pop();
    
    const bool* exitDirections = CONNECTION_INFO[_direction][_type][direction];    // Check for connection with all adjacent tiles (in the case that this is some arbitrary wire chosen and did not come from a source gate).
    if (exitDirections[0] && getPosition().y > 0) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y - 1)), NORTH, state, stage);
    }
    if (exitDirections[1] && getPosition().x < getBoardPtr()->getSize().x - 1) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x + 1, getPosition().y)), EAST, state, stage);
    }
    if (exitDirections[2] && getPosition().y < getBoardPtr()->getSize().y - 1) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y + 1)), SOUTH, state, stage);
    }
    if (exitDirections[3] && getPosition().x > 0) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x - 1, getPosition().y)), WEST, state, stage);
    }
    
    while (!wireNodes.empty()) {    // Perform depth-first traversal on remaining connected wires.
        TileWire* currentWire = wireNodes.top().first;
        Direction currentDirection = wireNodes.top().second;
        wireNodes.pop();
        //cout << "  currently at (" << currentWire->getPosition().x << ", " << currentWire->getPosition().y << ") going direction " << currentDirection << endl;
        
        const bool* exitDirections = CONNECTION_INFO[currentWire->_direction][currentWire->_type][currentDirection];    // Check for connection with adjacent tiles that do not point back to source wire.
        if (exitDirections[0] && currentDirection != SOUTH && currentWire->getPosition().y > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x, currentWire->getPosition().y - 1)), NORTH, state, stage);
        }
        if (exitDirections[1] && currentDirection != WEST && currentWire->getPosition().x < getBoardPtr()->getSize().x - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x + 1, currentWire->getPosition().y)), EAST, state, stage);
        }
        if (exitDirections[2] && currentDirection != NORTH && currentWire->getPosition().y < getBoardPtr()->getSize().y - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x, currentWire->getPosition().y + 1)), SOUTH, state, stage);
        }
        if (exitDirections[3] && currentDirection != EAST && currentWire->getPosition().x > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x - 1, currentWire->getPosition().y)), WEST, state, stage);
        }
    }
    
    if (stage == INVALID_STAGE) {    // Check if wire is in an invalid state and change it if so.
        _fixTraversedWires(MIDDLE);
        if (Simulator::getConfig().pauseOnConflict) {
            if (Board::numStateErrors < 10) {
                cout << "Detected state conflict in wire at position (" << getPosition().x << ", " << getPosition().y << ")." << endl;
            }
            ++Board::numStateErrors;
            for (pair<TileWire*, Direction>& wire : traversedWires) {
                wire.first->setHighlight(true);
            }
        }
    }
    traversedWires.clear();
}